

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANSIFontWriter.cpp
# Opt level: O0

void __thiscall ANSIFontWriter::CalculateCharacterEncodingArray(ANSIFontWriter *this)

{
  bool bVar1;
  pointer __x;
  pointer ppVar2;
  iterator __first;
  iterator __last;
  pair<unsigned_int,_GlyphEncodingInfo> local_48;
  _Self local_20;
  _Self local_18;
  iterator it;
  ANSIFontWriter *this_local;
  
  it._M_node = (_Base_ptr)this;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_GlyphEncodingInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>_>
       ::begin(&this->mFontOccurrence->mGlyphIDToEncodedChar);
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_GlyphEncodingInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>_>
         ::end(&this->mFontOccurrence->mGlyphIDToEncodedChar);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    __x = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>::operator->
                    (&local_18);
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>::operator->
                       (&local_18);
    std::pair<unsigned_int,_GlyphEncodingInfo>::pair<GlyphEncodingInfo_&,_true>
              (&local_48,&__x->first,&ppVar2->second);
    std::
    vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
    ::push_back(&this->mCharactersVector,&local_48);
    std::pair<unsigned_int,_GlyphEncodingInfo>::~pair(&local_48);
    std::_Rb_tree_iterator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>::operator++(&local_18)
    ;
  }
  __first = std::
            vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
            ::begin(&this->mCharactersVector);
  __last = std::
           vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
           ::end(&this->mCharactersVector);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,GlyphEncodingInfo>*,std::vector<std::pair<unsigned_int,GlyphEncodingInfo>,std::allocator<std::pair<unsigned_int,GlyphEncodingInfo>>>>,bool(*)(std::pair<unsigned_int,GlyphEncodingInfo>const&,std::pair<unsigned_int,GlyphEncodingInfo>const&)>
            ((__normal_iterator<std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
              )__last._M_current,sUShortSort);
  return;
}

Assistant:

void ANSIFontWriter::CalculateCharacterEncodingArray()
{
	// first we need to sort the fonts charachters by character code
	UIntToGlyphEncodingInfoMap::iterator it = mFontOccurrence->mGlyphIDToEncodedChar.begin();

	for(; it != mFontOccurrence->mGlyphIDToEncodedChar.end();++it)
		mCharactersVector.push_back(UIntAndGlyphEncodingInfo(it->first,it->second));

	std::sort(mCharactersVector.begin(),mCharactersVector.end(),sUShortSort);
}